

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_action.cc
# Opt level: O0

void re2c::emit_match(OutputFile *o,uint32_t ind,bool *readCh,State *s)

{
  OutputFile *this;
  opt_t *poVar1;
  bool local_a1;
  string local_a0;
  string local_80;
  string local_50;
  bool local_29;
  State *pSStack_28;
  bool read_ahead;
  State *s_local;
  bool *readCh_local;
  OutputFile *pOStack_10;
  uint32_t ind_local;
  OutputFile *o_local;
  
  pSStack_28 = s;
  s_local = (State *)readCh;
  readCh_local._4_4_ = ind;
  pOStack_10 = o;
  poVar1 = Opt::operator->((Opt *)&opts);
  this = pOStack_10;
  if (poVar1->target != DOT) {
    local_a1 = false;
    if ((pSStack_28 != (State *)0x0) && (local_a1 = false, pSStack_28->next != (State *)0x0)) {
      local_a1 = (pSStack_28->next->action).type != RULE;
    }
    local_29 = local_a1;
    if (pSStack_28->fill == 0) {
      if (local_a1 == false) {
        poVar1 = Opt::operator->((Opt *)&opts);
        InputAPI::stmt_skip_abi_cxx11_(&local_80,&poVar1->input_api,readCh_local._4_4_);
        OutputFile::wstring(this,&local_80);
        std::__cxx11::string::~string((string *)&local_80);
        *(undefined1 *)&(s_local->label).value = 1;
      }
      else {
        poVar1 = Opt::operator->((Opt *)&opts);
        InputAPI::stmt_skip_peek_abi_cxx11_(&local_a0,&poVar1->input_api,readCh_local._4_4_);
        OutputFile::wstring(this,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        *(undefined1 *)&(s_local->label).value = 0;
      }
    }
    else {
      poVar1 = Opt::operator->((Opt *)&opts);
      InputAPI::stmt_skip_abi_cxx11_(&local_50,&poVar1->input_api,readCh_local._4_4_);
      OutputFile::wstring(this,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    if (pSStack_28->fill != 0) {
      need(pOStack_10,readCh_local._4_4_,(bool *)s_local,pSStack_28->fill,false);
    }
  }
  return;
}

Assistant:

void emit_match (OutputFile & o, uint32_t ind, bool & readCh, const State * const s)
{
	if (opts->target == opt_t::DOT)
	{
		return;
	}

	const bool read_ahead = s
		&& s->next
		&& s->next->action.type != Action::RULE;
	if (s->fill != 0)
	{
		o.wstring(opts->input_api.stmt_skip (ind));
	}
	else if (!read_ahead)
	{
		/* do not read next char if match */
		o.wstring(opts->input_api.stmt_skip (ind));
		readCh = true;
	}
	else
	{
		o.wstring(opts->input_api.stmt_skip_peek (ind));
		readCh = false;
	}

	if (s->fill != 0)
	{
		need(o, ind, readCh, s->fill, false);
	}
}